

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.c
# Opt level: O0

sexp_conflict
sexp_make_variable_transformer_op
          (sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict base_proc)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  sexp_conflict in_RCX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  sexp_conflict flags;
  sexp_conflict local_8;
  
  if ((((ulong)in_RCX & 3) == 0) && (in_RCX->tag == 0x14)) {
    auVar1._8_8_ = (long)(in_RCX->value).flonum_bits[0x10] >> 0x3f;
    auVar1._0_8_ = (long)(in_RCX->value).flonum_bits[0x10] & 0xfffffffffffffffe;
    local_8 = in_RCX;
    if ((auVar1 / SEXT816(2) & (undefined1  [16])0x4) == (undefined1  [16])0x0) {
      auVar2._8_8_ = (long)(in_RCX->value).flonum_bits[0x10] >> 0x3f;
      auVar2._0_8_ = (long)(in_RCX->value).flonum_bits[0x10] & 0xfffffffffffffffe;
      local_8 = (sexp_conflict)
                sexp_make_procedure_op
                          (in_RDI,0,4,(SUB168(auVar2 / SEXT816(2),0) | 4) << 1 | 1,
                           (long)(in_RCX->value).procedure.num_args << 1 | 1,(in_RCX->value).flonum,
                           (in_RCX->value).type.cpl);
    }
  }
  else {
    local_8 = (sexp_conflict)sexp_type_exception(in_RDI,in_RSI,0x14,in_RCX);
  }
  return local_8;
}

Assistant:

sexp sexp_make_variable_transformer_op (sexp ctx, sexp self, sexp_sint_t n, sexp base_proc) {
  sexp flags;
  sexp_assert_type(ctx, sexp_procedurep, SEXP_PROCEDURE, base_proc);
  if (sexp_procedure_variable_transformer_p(base_proc))
    return base_proc;
  flags = sexp_make_fixnum(sexp_unbox_fixnum(sexp_procedure_flags(base_proc)) | SEXP_PROC_VARIABLE_TRANSFORMER);
  return sexp_make_procedure(ctx, flags,
                             sexp_make_fixnum(sexp_procedure_num_args(base_proc)),
                             sexp_procedure_code(base_proc),
                             sexp_procedure_vars(base_proc));
}